

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_use_manager.cpp
# Opt level: O0

void __thiscall
spvtools::opt::analysis::DefUseManager::AnalyzeInstUse(DefUseManager *this,Instruction *inst)

{
  spv_operand_type_t sVar1;
  uint uVar2;
  uint32_t uVar3;
  size_type sVar4;
  Operand *pOVar5;
  value_type local_40;
  Instruction *local_30;
  Instruction *def;
  uint32_t use_id;
  uint32_t i;
  mapped_type *used_ids;
  Instruction *inst_local;
  DefUseManager *this_local;
  
  used_ids = (mapped_type *)inst;
  inst_local = (Instruction *)this;
  _use_id = std::
            unordered_map<const_spvtools::opt::Instruction_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<const_spvtools::opt::Instruction_*>,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
            ::operator[](&this->inst_to_used_ids_,(key_type *)&used_ids);
  sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(_use_id);
  if (sVar4 != 0) {
    EraseUseRecordsOfOperandIds(this,(Instruction *)used_ids);
    _use_id = std::
              unordered_map<const_spvtools::opt::Instruction_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<const_spvtools::opt::Instruction_*>,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              ::operator[](&this->inst_to_used_ids_,(key_type *)&used_ids);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(_use_id);
  def._4_4_ = 0;
  do {
    uVar2 = def._4_4_;
    uVar3 = opt::Instruction::NumOperands((Instruction *)used_ids);
    if (uVar3 <= uVar2) {
      return;
    }
    pOVar5 = opt::Instruction::GetOperand((Instruction *)used_ids,def._4_4_);
    sVar1 = pOVar5->type;
    if ((sVar1 - SPV_OPERAND_TYPE_ID < 2) ||
       (sVar1 == SPV_OPERAND_TYPE_MEMORY_SEMANTICS_ID || sVar1 == SPV_OPERAND_TYPE_SCOPE_ID)) {
      def._0_4_ = opt::Instruction::GetSingleWordOperand((Instruction *)used_ids,def._4_4_);
      local_30 = GetDef(this,(uint32_t)def);
      if (local_30 == (Instruction *)0x0) {
        __assert_fail("def && \"Definition is not registered.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/def_use_manager.cpp"
                      ,0x38,
                      "void spvtools::opt::analysis::DefUseManager::AnalyzeInstUse(Instruction *)");
      }
      local_40.user = (Instruction *)used_ids;
      local_40.def = local_30;
      std::
      set<spvtools::opt::analysis::UserEntry,_spvtools::opt::analysis::UserEntryLess,_std::allocator<spvtools::opt::analysis::UserEntry>_>
      ::insert(&this->id_to_users_,&local_40);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (_use_id,(value_type *)&def);
    }
    def._4_4_ = def._4_4_ + 1;
  } while( true );
}

Assistant:

void DefUseManager::AnalyzeInstUse(Instruction* inst) {
  // Create entry for the given instruction. Note that the instruction may
  // not have any in-operands. In such cases, we still need a entry for those
  // instructions so this manager knows it has seen the instruction later.
  auto* used_ids = &inst_to_used_ids_[inst];
  if (used_ids->size()) {
    EraseUseRecordsOfOperandIds(inst);
    used_ids = &inst_to_used_ids_[inst];
  }
  used_ids->clear();  // It might have existed before.

  for (uint32_t i = 0; i < inst->NumOperands(); ++i) {
    switch (inst->GetOperand(i).type) {
      // For any id type but result id type
      case SPV_OPERAND_TYPE_ID:
      case SPV_OPERAND_TYPE_TYPE_ID:
      case SPV_OPERAND_TYPE_MEMORY_SEMANTICS_ID:
      case SPV_OPERAND_TYPE_SCOPE_ID: {
        uint32_t use_id = inst->GetSingleWordOperand(i);
        Instruction* def = GetDef(use_id);
        assert(def && "Definition is not registered.");
        id_to_users_.insert(UserEntry{def, inst});
        used_ids->push_back(use_id);
      } break;
      default:
        break;
    }
  }
}